

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::LessThanTest<unsigned_long,char>(void)

{
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_39;
  int local_38 [4];
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_28;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_20;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_18;
  
  local_38[3] = 3;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>(&local_18,local_38 + 3);
  if (2 < local_18.m_int) {
    local_38[2] = 4;
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<int>(&local_20,local_38 + 2);
    if (local_20.m_int < 5) {
      local_38[1] = 6;
      SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<int>(&local_28,local_38 + 1);
      local_38[0] = 7;
      SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      SafeInt<int>(&local_39,local_38);
      return local_28.m_int < (byte)local_39.m_int && -1 < local_39.m_int;
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool LessThanTest()
	{
		return
			(U)2 < SafeInt<T>(3) &&
			SafeInt<T>(4) < (U)5 &&
			SafeInt<T>(6) < SafeInt<U>(7);
	}